

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::usda::CheckAllowedTokens<tinyusdz::APISchemas::APIName>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
          *allowedTokens,string *tok)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  type *ppcVar8;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [40];
  string local_100;
  undefined1 local_e0 [32];
  string local_c0 [32];
  undefined1 local_a0 [8];
  string s;
  value_type local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  ulong local_30;
  size_t i;
  string *local_20;
  string *tok_local;
  vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
  *allowedTokens_local;
  
  local_20 = tok;
  tok_local = (string *)allowedTokens;
  allowedTokens_local =
       (vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
        *)__return_storage_ptr__;
  bVar4 = ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
          ::empty(allowedTokens);
  if (bVar4) {
    i._7_1_ = 1;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<bool,_0>(__return_storage_ptr__,(bool *)((long)&i + 7));
  }
  else {
    for (local_30 = 0;
        sVar6 = ::std::
                vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                ::size((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                        *)tok_local), psVar3 = local_20, local_30 < sVar6; local_30 = local_30 + 1)
    {
      pvVar7 = ::std::
               vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               ::operator[]((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                             *)tok_local,local_30);
      ::std::get<1ul,tinyusdz::APISchemas::APIName,char_const*>(pvVar7);
      iVar5 = ::std::__cxx11::string::compare((char *)psVar3);
      if (iVar5 == 0) {
        toks.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<bool,_0>(__return_storage_ptr__,
                            (bool *)((long)&toks.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7))
        ;
        return __return_storage_ptr__;
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1);
    for (local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0; pvVar2 = local_58,
        v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)::std::
               vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               ::size((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                       *)tok_local), pvVar2 < v;
        local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(local_58->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar7 = ::std::
               vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               ::operator[]((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                             *)tok_local,(size_type)local_58);
      ppcVar8 = ::std::get<1ul,tinyusdz::APISchemas::APIName,char_const*>(pvVar7);
      pcVar1 = *ppcVar8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_78,pcVar1,(allocator *)(s.field_2._M_local_buf + 0xf));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_1,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_c0,", ",(allocator *)(local_e0 + 0x1f));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_100,"\"",(allocator *)(local_128 + 0x27));
    quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_e0,
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&i_1,&local_100);
    join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_a0,(tinyusdz *)local_c0,(string *)local_e0,v);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_128 + 0x27));
    ::std::__cxx11::string::~string(local_c0);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_e0 + 0x1f));
    ::std::operator+((char *)&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Allowed tokens are [");
    ::std::operator+(&local_188,&local_1a8,"] but got ");
    psVar3 = local_20;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1e8,"\"",&local_1e9);
    quote(&local_1c8,psVar3,&local_1e8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_188);
    ::std::operator+(&local_148,&local_168,".");
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_128,(expected_lite *)&local_148,value);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_128);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_128);
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_1c8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    ::std::__cxx11::string::~string((string *)local_a0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i_1);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<bool, std::string> CheckAllowedTokens(
    const std::vector<std::pair<E, const char *>> &allowedTokens,
    const std::string &tok) {
  if (allowedTokens.empty()) {
    return true;
  }

  for (size_t i = 0; i < allowedTokens.size(); i++) {
    if (tok.compare(std::get<1>(allowedTokens[i])) == 0) {
      return true;
    }
  }

  std::vector<std::string> toks;
  for (size_t i = 0; i < allowedTokens.size(); i++) {
    toks.push_back(std::get<1>(allowedTokens[i]));
  }

  std::string s = join(", ", tinyusdz::quote(toks));

  return nonstd::make_unexpected("Allowed tokens are [" + s + "] but got " +
                                 quote(tok) + ".");
}